

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

ON_Interval __thiscall
ON_NurbsSurface::ControlPointSupport(ON_NurbsSurface *this,int dir,int control_point_index)

{
  ON_Interval OVar1;
  int control_point_index_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  double local_10;
  
  if ((dir == 0) || (dir == 1)) {
    _this_local = ON_BsplineControlPointSupport
                            (this->m_order[dir],this->m_cv_count[dir],this->m_knot[dir],
                             control_point_index);
  }
  else {
    local_10 = ON_Interval::Nan.m_t[1];
    this_local = (ON_NurbsSurface *)ON_Interval::Nan.m_t[0];
  }
  OVar1.m_t[0] = (double)this_local;
  OVar1.m_t[1] = local_10;
  return (ON_Interval)OVar1.m_t;
}

Assistant:

const ON_Interval ON_NurbsSurface::ControlPointSupport(int dir, int control_point_index) const
{
  if (0 == dir || 1 == dir)
    return ON_BsplineControlPointSupport(
      this->m_order[dir],
      this->m_cv_count[dir],
      this->m_knot[dir],
      control_point_index
    );
  return ON_Interval::Nan;
}